

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int CVodeSetNonlinearSolver(void *cvode_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  SUNNonlinearSolver in_RSI;
  CVodeMem in_RDI;
  int retval;
  CVodeMem cv_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x37,"CVodeSetNonlinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    cvProcessError((CVodeMem)0x0,-0x16,0x3f,"CVodeSetNonlinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    cvProcessError(in_RDI,-0x16,0x48,"CVodeSetNonlinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else {
    if ((in_RDI->NLS != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLS != 0)) {
      SUNNonlinSolFree(in_RDI->NLS);
    }
    in_RDI->NLS = in_RSI;
    in_RDI->ownNLS = 0;
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLS,cvNlsResidual);
    }
    else {
      iVar1 = SUNNonlinSolGetType(in_RSI);
      if (iVar1 != 1) {
        cvProcessError(in_RDI,-0x16,0x65,"CVodeSetNonlinearSolver",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                       ,"Invalid nonlinear solver type");
        return -0x16;
      }
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLS,cvNlsFPFunction);
    }
    if (local_24 == 0) {
      iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLS,cvNlsConvTest,in_RDI);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLS,3);
        if (iVar1 == 0) {
          in_RDI->cv_acnrmcur = 0;
          if (in_RDI->cv_f == (CVRhsFn)0x0) {
            cvProcessError(in_RDI,-0x16,0x89,"CVodeSetNonlinearSolver",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                           ,"The ODE RHS function is NULL");
            local_4 = -0x16;
          }
          else {
            in_RDI->nls_f = in_RDI->cv_f;
            local_4 = 0;
          }
        }
        else {
          cvProcessError(in_RDI,-0x16,0x7e,"CVodeSetNonlinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                         ,"Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        cvProcessError(in_RDI,-0x16,0x75,"CVodeSetNonlinearSolver",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                       ,"Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,0x6c,"CVodeSetNonlinearSolver",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                     ,"Setting nonlinear system function failed");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetNonlinearSolver(void* cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS does not support required operations");
    return (CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLS != NULL) && (cv_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(cv_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLS = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLS = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsResidual);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLS, cvNlsFPFunction);
  }
  else
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid nonlinear solver type");
    return (CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting nonlinear system function failed");
    return (CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLS, cvNlsConvTest, cvode_mem);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting convergence test function failed");
    return (CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLS, NLS_MAXCOR);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting maximum number of nonlinear iterations failed");
    return (CV_ILL_INPUT);
  }

  /* Reset the acnrmcur flag to SUNFALSE */
  cv_mem->cv_acnrmcur = SUNFALSE;

  /* Set the nonlinear system RHS function */
  if (!(cv_mem->cv_f))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "The ODE RHS function is NULL");
    return (CV_ILL_INPUT);
  }
  cv_mem->nls_f = cv_mem->cv_f;

  return (CV_SUCCESS);
}